

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_fileextension(mcu8str *__return_storage_ptr__,mcu8str *path)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar1 = mctools_basename_view(path);
  pcVar2 = (char *)0x0;
  for (; (pcVar3 = pcVar1, *pcVar1 == '.' || (pcVar3 = pcVar2, *pcVar1 != '\0'));
      pcVar1 = pcVar1 + 1) {
    pcVar2 = pcVar3;
  }
  pcVar3 = pcVar2 + 1;
  if (pcVar2 == (char *)0x0) {
    pcVar3 = pcVar1;
  }
  mcu8str_create_from_cstr(__return_storage_ptr__,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_fileextension( const mcu8str* path )
  {
    const char * it = mctools_fileextension_view( path );
    return mcu8str_create_from_cstr( it );
  }